

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize.cpp
# Opt level: O2

VkPipelineColorBlendStateCreateInfo * __thiscall
Fossilize::StateRecorder::Impl::copy<VkPipelineColorBlendStateCreateInfo>
          (Impl *this,VkPipelineColorBlendStateCreateInfo *src,size_t count,ScratchAllocator *alloc)

{
  VkPipelineColorBlendStateCreateInfo *pVVar1;
  
  if (count != 0) {
    pVVar1 = ScratchAllocator::allocate_n<VkPipelineColorBlendStateCreateInfo>(alloc,count);
    if (pVVar1 != (VkPipelineColorBlendStateCreateInfo *)0x0) {
      pVVar1 = (VkPipelineColorBlendStateCreateInfo *)memmove(pVVar1,src,count * 0x38);
      return pVVar1;
    }
  }
  return (VkPipelineColorBlendStateCreateInfo *)0x0;
}

Assistant:

T *StateRecorder::Impl::copy(const T *src, size_t count, ScratchAllocator &alloc)
{
	if (!count)
		return nullptr;

	auto *new_data = alloc.allocate_n<T>(count);
	if (new_data)
		std::copy(src, src + count, new_data);
	return new_data;
}